

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_inplace_negation_array0(void)

{
  roaring_bitmap_t *range_start;
  roaring_bitmap_t *r1;
  char *in_stack_00000008;
  roaring_bitmap_t *in_stack_00000010;
  int line;
  
  range_start = roaring_bitmap_create();
  _assert_true((unsigned_long)in_stack_00000010,in_stack_00000008,(char *)r1,
               (int)((ulong)range_start >> 0x20));
  roaring_bitmap_flip_inplace(r1,(uint64_t)range_start,0x112e39);
  line = (int)((ulong)range_start >> 0x20);
  _assert_true((unsigned_long)in_stack_00000010,in_stack_00000008,(char *)r1,line);
  roaring_bitmap_get_cardinality(in_stack_00000010);
  _assert_int_equal((unsigned_long)in_stack_00000010,(unsigned_long)in_stack_00000008,(char *)r1,
                    line);
  roaring_bitmap_free((roaring_bitmap_t *)0x112e80);
  return;
}

Assistant:

DEFINE_TEST(test_inplace_negation_array0) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    assert_non_null(r1);

    roaring_bitmap_flip_inplace(r1, 200U, 500U);
    assert_non_null(r1);
    assert_int_equal(300, roaring_bitmap_get_cardinality(r1));

    roaring_bitmap_free(r1);
}